

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.hpp
# Opt level: O1

void __thiscall
nestl::has_exceptions::vector<int,_nestl::allocator<int>_>::vector
          (vector<int,_nestl::allocator<int>_> *this,vector<int,_nestl::allocator<int>_> *other)

{
  pointer piVar1;
  pointer piVar2;
  pointer piVar3;
  undefined8 uVar4;
  default_operation_error err;
  long local_30;
  long local_28;
  long local_20;
  
  (this->super_vector<int,_nestl::allocator<int>_>).m_start = (pointer)0x0;
  (this->super_vector<int,_nestl::allocator<int>_>).m_finish = (pointer)0x0;
  (this->super_vector<int,_nestl::allocator<int>_>).m_end_of_storage = (pointer)0x0;
  local_20 = 0;
  piVar1 = (other->super_vector<int,_nestl::allocator<int>_>).m_start;
  piVar2 = (other->super_vector<int,_nestl::allocator<int>_>).m_finish;
  piVar3 = (this->super_vector<int,_nestl::allocator<int>_>).m_start;
  (this->super_vector<int,_nestl::allocator<int>_>).m_end_of_storage = (pointer)0x0;
  (this->super_vector<int,_nestl::allocator<int>_>).m_start = (pointer)0x0;
  (this->super_vector<int,_nestl::allocator<int>_>).m_finish = (pointer)0x0;
  impl::vector<int,nestl::allocator<int>>::
  assign_iterator<nestl::has_exceptions::exception_ptr_error,int_const*>
            ((vector<int,nestl::allocator<int>> *)this,&local_20,piVar1,piVar2);
  operator_delete(piVar3);
  if (local_20 == 0) {
    return;
  }
  local_28 = local_20;
  std::__exception_ptr::exception_ptr::_M_addref();
  local_30 = local_28;
  if (local_28 != 0) {
    std::__exception_ptr::exception_ptr::_M_addref();
  }
  uVar4 = std::rethrow_exception((exception_ptr)&local_30);
  if (local_30 != 0) {
    std::__exception_ptr::exception_ptr::_M_release();
  }
  has_exceptions::vector();
  operator_delete((this->super_vector<int,_nestl::allocator<int>_>).m_start);
  _Unwind_Resume(uVar4);
}

Assistant:

vector<T, A>::vector(const vector& other)
    : base_t(other.get_allocator())
{
    default_operation_error err;
    this->copy_nothrow(err, other);
    if (err)
    {
        throw_exception(err);
    }
}